

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Descriptor::GetKeyDataAll
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Descriptor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  pointer pDVar1;
  bool bVar2;
  pointer object;
  pointer pDVar3;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  key_list;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ref_list;
  DescriptorScriptReference script_data;
  KeyData key_data;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_700;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_6e8;
  DescriptorScriptReference local_6d0;
  DescriptorScriptReference local_380;
  
  GetReferenceAll(&local_6e8,this,array_argument);
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6e8.
      super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_6e8.
      super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    object = local_6e8.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      DescriptorScriptReference::DescriptorScriptReference(&local_6d0,object);
      while( true ) {
        if (local_6d0.keys_.
            super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_6d0.keys_.
            super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ::std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::vector(&local_700,&local_6d0.keys_);
          pDVar1 = local_700.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pDVar3 = local_700.
                        super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        ._M_impl.super__Vector_impl_data._M_start; pDVar3 != pDVar1;
              pDVar3 = pDVar3 + 1) {
            KeyData::KeyData((KeyData *)&local_380,&pDVar3->key_data_);
            bVar2 = KeyData::IsValid((KeyData *)&local_380);
            if (bVar2) {
              ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                        (__return_storage_ptr__,(value_type *)&local_380);
            }
            KeyData::~KeyData((KeyData *)&local_380);
          }
          ::std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector(&local_700);
        }
        if (local_6d0.is_script_ != true) break;
        DescriptorScriptReference::DescriptorScriptReference
                  (&local_380,
                   local_6d0.child_script_.
                   super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        DescriptorScriptReference::operator=(&local_6d0,&local_380);
        DescriptorScriptReference::~DescriptorScriptReference(&local_380);
      }
      DescriptorScriptReference::~DescriptorScriptReference(&local_6d0);
      object = object + 1;
    } while (object != local_6e8.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&local_6e8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<KeyData> Descriptor::GetKeyDataAll(
    const std::vector<std::string>* array_argument) const {
  std::vector<DescriptorScriptReference> ref_list =
      GetReferenceAll(array_argument);
  std::vector<KeyData> result;

  for (const auto& ref : ref_list) {
    auto script_data = ref;
    do {
      if (script_data.HasKey()) {
        auto key_list = script_data.GetKeyList();
        for (const auto& key : key_list) {
          auto key_data = key.GetKeyData();
          if (key_data.IsValid()) {
            result.push_back(key_data);
          }
        }
      }
      if (!script_data.HasChild()) {
        break;
      }
      script_data = script_data.GetChild();
    } while (true);
  }
  return result;
}